

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTHelperVisitors.cpp
# Opt level: O0

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * getIdentifier(Expression *expr)

{
  bool bVar1;
  MemberAccessExpression *this;
  Expression *pEVar2;
  NamedValueExpression *pNVar3;
  Expression *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  MemberAccessExpression *memberAccess;
  Symbol *symbol;
  Expression *in_stack_00000028;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  ValueSymbol *local_10;
  
  local_10 = (ValueSymbol *)0x0;
  this_00 = in_RDI;
  bVar1 = slang::ast::MemberAccessExpression::isKind(in_RSI->kind);
  if (bVar1) {
    this = slang::ast::Expression::as<slang::ast::MemberAccessExpression>(in_RSI);
    pEVar2 = slang::ast::MemberAccessExpression::value(this);
    bVar1 = slang::ast::NamedValueExpression::isKind(pEVar2->kind);
    if (bVar1) {
      pEVar2 = slang::ast::MemberAccessExpression::value(this);
      pNVar3 = slang::ast::Expression::as<slang::ast::NamedValueExpression>(pEVar2);
      local_10 = (pNVar3->super_ValueExpressionBase).symbol;
    }
  }
  else {
    local_10 = (ValueSymbol *)
               slang::ast::Expression::getSymbolReference(in_stack_00000028,expr._7_1_);
  }
  if (local_10 == (ValueSymbol *)0x0) {
    std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x1cbb49);
  }
  else {
    std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
    optional<const_std::basic_string_view<char,_std::char_traits<char>_>_&,_true>
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)this_00,in_RDI);
  }
  return (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)this_00;
}

Assistant:

std::optional<std::string_view> getIdentifier(const slang::ast::Expression& expr) {
    const slang::ast::Symbol* symbol = nullptr;
    if (slang::ast::MemberAccessExpression::isKind(expr.kind)) {
        auto& memberAccess = expr.as<slang::ast::MemberAccessExpression>();
        if (slang::ast::NamedValueExpression::isKind(memberAccess.value().kind))
            symbol = &memberAccess.value().as<slang::ast::NamedValueExpression>().symbol;
    }
    else {
        symbol = expr.getSymbolReference();
    }

    if (symbol) {
        return symbol->name;
    }
    return {};
}